

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m4vd_vdpu2.c
# Opt level: O0

void vdpu2_mpg4d_setup_regs_by_syntax(hal_mpg4_ctx *ctx,MppSyntax syntax)

{
  RK_U8 RVar1;
  uint uVar2;
  void *pvVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  void *__dest;
  uint local_c8;
  uint local_c0;
  uint local_b8;
  RK_U8 *local_a8;
  RK_U8 *local_a0;
  RK_U32 trb_per_trd_dm1;
  RK_U32 trb_per_trd_d1;
  RK_U32 trb_per_trd_d0;
  RK_U32 time_pp;
  RK_U32 time_bp;
  RK_U32 left_bytes;
  RK_U32 start_bit_offset;
  RK_U32 consumed_bytes_align;
  RK_U32 consumed_bytes;
  RK_U32 val;
  RK_U8 *src;
  RK_U8 *dst;
  DXVA2_DecodeBufferDesc *desc;
  RK_U32 i;
  RK_U32 stream_used;
  RK_U32 stream_length;
  RK_S32 mv_buf_fd;
  DXVA_QmatrixData *qm;
  DXVA_PicParams_MPEG4_PART2 *pp;
  DXVA2_DecodeBufferDesc **data;
  M4vdVdpu2Regs_t *regs;
  hal_mpg4_ctx *ctx_local;
  MppSyntax syntax_local;
  
  pvVar3 = ctx->regs;
  qm = (DXVA_QmatrixData *)0x0;
  _stream_length = (char *)0x0;
  iVar5 = mpp_buffer_get_fd_with_caller(ctx->mv_buf,"vdpu2_mpg4d_setup_regs_by_syntax");
  i = 0;
  desc._4_4_ = 0;
  for (desc._0_4_ = 0; (uint)desc < syntax.number; desc._0_4_ = (uint)desc + 1) {
    puVar4 = *(uint **)((long)syntax.data + (ulong)(uint)desc * 8);
    uVar6 = *puVar4;
    if (uVar6 == 0) {
      qm = *(DXVA_QmatrixData **)(puVar4 + 10);
    }
    else if (uVar6 == 4) {
      _stream_length = *(char **)(puVar4 + 10);
    }
    else if (uVar6 == 6) {
      i = puVar4[3];
      desc._4_4_ = puVar4[2];
      ctx->bitstrm_len = i;
    }
    else {
      _mpp_log_l(2,"hal_m4vd_vdpu2","found invalid buffer descriptor type %d\n",
                 "vdpu2_mpg4d_setup_regs_by_syntax",(ulong)*puVar4);
    }
  }
  if ((qm == (DXVA_QmatrixData *)0x0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu2","Assertion %s failed at %s:%d\n",(char *)0x0,"pp",
                 "vdpu2_mpg4d_setup_regs_by_syntax",0x42), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((_stream_length == (char *)0x0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu2","Assertion %s failed at %s:%d\n",(char *)0x0,"qm",
                 "vdpu2_mpg4d_setup_regs_by_syntax",0x43), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((i == 0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu2","Assertion %s failed at %s:%d\n",(char *)0x0,"stream_length",
                 "vdpu2_mpg4d_setup_regs_by_syntax",0x44), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((desc._4_4_ == 0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu2","Assertion %s failed at %s:%d\n",(char *)0x0,"stream_used",
                 "vdpu2_mpg4d_setup_regs_by_syntax",0x45), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  __dest = mpp_buffer_get_ptr_with_caller(ctx->qp_table,"vdpu2_mpg4d_setup_regs_by_syntax");
  if (*_stream_length == '\0') {
    local_a0 = default_intra_matrix;
  }
  else {
    local_a0 = (RK_U8 *)(_stream_length + 4);
  }
  memcpy(__dest,local_a0,0x40);
  if (_stream_length[1] == '\0') {
    local_a8 = default_inter_matrix;
  }
  else {
    local_a8 = (RK_U8 *)(_stream_length + 0x44);
  }
  memcpy((void *)((long)__dest + 0x40),local_a8,0x40);
  *(uint *)((long)pvVar3 + 0x1e0) =
       *(uint *)((long)pvVar3 + 0x1e0) & 0x7fffff |
       ((int)(*(ushort *)(qm->Qmatrix[0] + 0x20) + 0xf) >> 4) << 0x17;
  *(uint *)((long)pvVar3 + 0x1e0) =
       *(uint *)((long)pvVar3 + 0x1e0) & 0xfff807ff |
       ((int)(*(ushort *)(qm->Qmatrix[0] + 0x22) + 0xf) >> 4 & 0xffU) << 0xb;
  if (*(int *)qm->Qmatrix[1] == 4) {
    *(uint *)((long)pvVar3 + 0x1e0) =
         *(uint *)((long)pvVar3 + 0x1e0) & 0xff87ffff |
         (*(ushort *)(qm->Qmatrix[0] + 0x20) & 0xf) << 0x13;
    *(uint *)((long)pvVar3 + 0x1e0) =
         *(uint *)((long)pvVar3 + 0x1e0) & 0xfffff87f |
         (*(ushort *)(qm->Qmatrix[0] + 0x22) & 0xf) << 7;
  }
  else {
    *(uint *)((long)pvVar3 + 0x1e0) = *(uint *)((long)pvVar3 + 0x1e0) & 0xff87ffff;
    *(uint *)((long)pvVar3 + 0x1e0) = *(uint *)((long)pvVar3 + 0x1e0) & 0xfffff87f;
  }
  *(undefined4 *)((long)pvVar3 + 0xd4) = 1;
  *(uint *)((long)pvVar3 + 0x220) =
       *(uint *)((long)pvVar3 + 0x220) & 0xfff7ffff |
       (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 0xf) << 0x13;
  *(uint *)((long)pvVar3 + 0xd0) = *(uint *)((long)pvVar3 + 0xd0) & 0xfffe00ff;
  *(uint *)((long)pvVar3 + 0xd0) = *(uint *)((long)pvVar3 + 0xd0) & 0xffffff00;
  *(uint *)((long)pvVar3 + 200) = *(uint *)((long)pvVar3 + 200) & 0xfffffeff | 0x100;
  *(uint *)((long)pvVar3 + 0x220) =
       *(uint *)((long)pvVar3 + 0x220) & 0xfffffffd |
       (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 10 & 1) << 1;
  *(uint *)((long)pvVar3 + 0x1e8) =
       *(uint *)((long)pvVar3 + 0x1e8) & 0xfff8ffff |
       (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 0xb & 7) << 0x10;
  *(uint *)((long)pvVar3 + 0xcc) =
       *(uint *)((long)pvVar3 + 0xcc) & 0x81ffffff | (qm->bNewQmatrix[2] & 0x3f) << 0x19;
  *(uint *)((long)pvVar3 + 0x1e8) = *(uint *)((long)pvVar3 + 0x1e8) & 0xfdffffff | 0x2000000;
  uVar6 = desc._4_4_ >> 3 & 0xfffffff8;
  *(undefined4 *)((long)pvVar3 + 0x100) = *(undefined4 *)((long)pvVar3 + 0x100);
  if (uVar6 != 0) {
    mpp_dev_set_reg_offset(ctx->dev,0x40,uVar6);
  }
  *(uint *)((long)pvVar3 + 0x1e8) = *(uint *)((long)pvVar3 + 0x1e8) & 0x3ffffff | desc._4_4_ << 0x1a
  ;
  *(uint *)((long)pvVar3 + 0xcc) =
       (uint)*(byte *)((long)pvVar3 + 0xcf) << 0x18 | i - uVar6 & 0xffffff;
  *(undefined2 *)((long)pvVar3 + 0x1e8) = *(undefined2 *)(qm->Qmatrix[0] + 8);
  RVar1 = qm->bNewQmatrix[1];
  if (RVar1 == '\0') {
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xffff7fff;
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xffffbfff;
    *(RK_S32 *)((long)pvVar3 + 0x20c) = ctx->fd_curr;
    *(RK_S32 *)((long)pvVar3 + 0x250) = ctx->fd_curr;
    *(RK_S32 *)((long)pvVar3 + 0x218) = ctx->fd_curr;
    *(RK_S32 *)((long)pvVar3 + 0x21c) = ctx->fd_curr;
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xfffffbff;
    *(int *)((long)pvVar3 + 0xf8) = iVar5;
    *(uint *)((long)pvVar3 + 0x220) = *(uint *)((long)pvVar3 + 0x220) & 0xfff87fff | 0x8000;
    *(uint *)((long)pvVar3 + 0x220) = *(uint *)((long)pvVar3 + 0x220) & 0xffff87ff | 0x800;
  }
  else if (RVar1 == '\x01') {
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xffff7fff;
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xffffbfff | 0x4000;
    if (ctx->fd_ref0 < 0) {
      *(RK_S32 *)((long)pvVar3 + 0x20c) = ctx->fd_curr;
      *(RK_S32 *)((long)pvVar3 + 0x250) = ctx->fd_curr;
    }
    else {
      *(RK_S32 *)((long)pvVar3 + 0x20c) = ctx->fd_ref0;
      *(RK_S32 *)((long)pvVar3 + 0x250) = ctx->fd_ref0;
    }
    *(RK_S32 *)((long)pvVar3 + 0x218) = ctx->fd_curr;
    *(RK_S32 *)((long)pvVar3 + 0x21c) = ctx->fd_curr;
    *(uint *)((long)pvVar3 + 0x220) =
         *(uint *)((long)pvVar3 + 0x220) & 0xfff87fff | (uint)(qm->Qmatrix[0][0x36] & 7) << 0xf;
    *(uint *)((long)pvVar3 + 0x220) =
         *(uint *)((long)pvVar3 + 0x220) & 0xffff87ff | (uint)(qm->Qmatrix[0][0x36] & 7) << 0xb;
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xfffffbff | 0x400;
    *(int *)((long)pvVar3 + 0xf8) = iVar5;
  }
  else if (RVar1 == '\x02') {
    uVar6 = *(uint *)(qm->Qmatrix[1] + 8);
    uVar2 = *(uint *)(qm->Qmatrix[1] + 0xc);
    if (uVar2 == 0) {
      local_b8 = 0xffffffff;
    }
    else {
      local_b8 = (uint)(((ulong)uVar6 * 0x8000000 + (ulong)(uVar2 - 1)) / (ulong)uVar2);
    }
    if (uVar2 * 2 == -1) {
      local_c0 = uVar2 * 2;
    }
    else {
      local_c0 = (uint)(((ulong)(uVar6 * 2 + 1) * 0x8000000 + (ulong)(uVar2 << 1)) /
                       (ulong)(uVar2 * 2 + 1));
    }
    if (uVar2 * 2 == 1) {
      local_c8 = (uVar2 - 1) * 2;
    }
    else {
      local_c8 = (uint)(((ulong)(uVar6 * 2 - 1) * 0x8000000 + (ulong)((uVar2 - 1) * 2)) /
                       (ulong)(uVar2 * 2 - 1));
    }
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xffff7fff | 0x8000;
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xffffbfff | 0x4000;
    *(uint *)((long)pvVar3 + 0x220) = *(uint *)((long)pvVar3 + 0x220) & 0xfffffffd;
    *(undefined4 *)((long)pvVar3 + 0x20c) = 1;
    if ((ctx->fd_ref1 < 0) &&
       (_mpp_log_l(2,"hal_m4vd_vdpu2","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "ctx->fd_ref1 >= 0","vdpu2_mpg4d_setup_regs_by_syntax",0x8f),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (ctx->fd_ref1 < 0) {
      *(RK_S32 *)((long)pvVar3 + 0x20c) = ctx->fd_curr;
      *(RK_S32 *)((long)pvVar3 + 0x250) = ctx->fd_curr;
    }
    else {
      *(RK_S32 *)((long)pvVar3 + 0x20c) = ctx->fd_ref1;
      *(RK_S32 *)((long)pvVar3 + 0x250) = ctx->fd_ref1;
    }
    if ((ctx->fd_ref0 < 0) &&
       (_mpp_log_l(2,"hal_m4vd_vdpu2","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "ctx->fd_ref0 >= 0","vdpu2_mpg4d_setup_regs_by_syntax",0x98),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (ctx->fd_ref0 < 0) {
      *(RK_S32 *)((long)pvVar3 + 0x218) = ctx->fd_curr;
      *(RK_S32 *)((long)pvVar3 + 0x21c) = ctx->fd_curr;
    }
    else {
      *(RK_S32 *)((long)pvVar3 + 0x218) = ctx->fd_ref0;
      *(RK_S32 *)((long)pvVar3 + 0x21c) = ctx->fd_ref0;
    }
    *(uint *)((long)pvVar3 + 0x220) =
         *(uint *)((long)pvVar3 + 0x220) & 0xfff87fff | (uint)(qm->Qmatrix[0][0x36] & 7) << 0xf;
    *(uint *)((long)pvVar3 + 0x220) =
         *(uint *)((long)pvVar3 + 0x220) & 0xffff87ff | (uint)(qm->Qmatrix[0][0x36] & 7) << 0xb;
    *(uint *)((long)pvVar3 + 0x220) =
         *(uint *)((long)pvVar3 + 0x220) & 0xfffff87f | (uint)(qm->Qmatrix[0][0x36] >> 3 & 7) << 7;
    *(uint *)((long)pvVar3 + 0x220) =
         *(uint *)((long)pvVar3 + 0x220) & 0xffffff87 | (uint)(qm->Qmatrix[0][0x36] >> 3 & 7) << 3;
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xfffffbff;
    *(int *)((long)pvVar3 + 0xf8) = iVar5;
    *(uint *)((long)pvVar3 + 0x224) =
         *(uint *)((long)pvVar3 + 0x224) & 0xf8000000 | local_b8 & 0x7ffffff;
    *(uint *)((long)pvVar3 + 0x22c) =
         *(uint *)((long)pvVar3 + 0x22c) & 0xf8000000 | local_c0 & 0x7ffffff;
    *(uint *)((long)pvVar3 + 0x228) =
         *(uint *)((long)pvVar3 + 0x228) & 0xf8000000 | local_c8 & 0x7ffffff;
  }
  if ((*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 2 & 1) != 0) {
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xfffdffff | 0x20000;
    *(uint *)((long)pvVar3 + 0xe4) = *(uint *)((long)pvVar3 + 0xe4) & 0xfffeffff;
    *(uint *)((long)pvVar3 + 0x1e0) =
         *(uint *)((long)pvVar3 + 0x1e0) & 0xffffffdf |
         (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 0xe & 1) << 5;
  }
  *(uint *)((long)pvVar3 + 0x220) =
       *(uint *)((long)pvVar3 + 0x220) & 0xfffffffe | *(uint *)(qm->Qmatrix[1] + 4) & 1;
  *(uint *)((long)pvVar3 + 0x1e8) =
       *(uint *)((long)pvVar3 + 0x1e8) & 0xfeffffff |
       (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 3 & 1) << 0x18;
  iVar5 = mpp_buffer_get_fd_with_caller(ctx->qp_table,"vdpu2_mpg4d_setup_regs_by_syntax");
  *(int *)((long)pvVar3 + 0xf4) = iVar5;
  *(uint *)((long)pvVar3 + 0x220) =
       *(uint *)((long)pvVar3 + 0x220) & 0xfffffffb |
       (uint)(*(ushort *)(qm->Qmatrix[0] + 0x1c) >> 4 & 1) << 2;
  return;
}

Assistant:

static void vdpu2_mpg4d_setup_regs_by_syntax(hal_mpg4_ctx *ctx, MppSyntax syntax)
{
    M4vdVdpu2Regs_t *regs = ctx->regs;
    DXVA2_DecodeBufferDesc **data = syntax.data;
    DXVA_PicParams_MPEG4_PART2 *pp = NULL;
    DXVA_QmatrixData *qm = NULL;
    RK_S32 mv_buf_fd = mpp_buffer_get_fd(ctx->mv_buf);
    RK_U32 stream_length = 0;
    RK_U32 stream_used = 0;
    RK_U32 i;

    for (i = 0; i < syntax.number; i++) {
        DXVA2_DecodeBufferDesc *desc = data[i];
        switch (desc->CompressedBufferType) {
        case DXVA2_PictureParametersBufferType : {
            pp = (DXVA_PicParams_MPEG4_PART2 *)desc->pvPVPState;
        } break;
        case DXVA2_InverseQuantizationMatrixBufferType : {
            qm = (DXVA_QmatrixData *)desc->pvPVPState;
        } break;
        case DXVA2_BitStreamDateBufferType : {
            stream_length = desc->DataSize;
            stream_used = desc->DataOffset;
            ctx->bitstrm_len = stream_length;
        } break;
        default : {
            mpp_err_f("found invalid buffer descriptor type %d\n", desc->CompressedBufferType);
        } break;
        }
    }

    mpp_assert(pp);
    mpp_assert(qm);
    mpp_assert(stream_length);
    mpp_assert(stream_used);

    // copy qp table to buffer
    {
        RK_U8 *dst = (RK_U8 *)mpp_buffer_get_ptr(ctx->qp_table);
        RK_U8 *src = (qm->bNewQmatrix[0]) ? (qm->Qmatrix[0]) : (default_intra_matrix);

        memcpy(dst, src, 64);
        dst += 64;

        src = (qm->bNewQmatrix[1]) ? (qm->Qmatrix[1]) : (default_inter_matrix);
        memcpy(dst, src, 64);
    }

    regs->reg120.sw_pic_mb_width = (pp->vop_width  + 15) >> 4;
    regs->reg120.sw_pic_mb_hight_p = (pp->vop_height + 15) >> 4;
    if (pp->custorm_version == 4) {
        regs->reg120.sw_mb_width_off = pp->vop_width & 0xf;
        regs->reg120.sw_mb_height_off = pp->vop_height & 0xf;
    } else {
        regs->reg120.sw_mb_width_off = 0;
        regs->reg120.sw_mb_height_off = 0;
    }
    regs->reg53_dec_mode = 1;

    /* note: When comparing bit 19 of reg136(that is sw_alt_scan_flag_e) with bit 6 of
    **       reg120(that is sw_alt_scan_e), we may be confused about the function of
    **       these two bits. According to C Model, just sw_alt_scan_flag_e is set,
    **       but not sw_alt_scan_e.
    */
    regs->reg136.sw_alt_scan_flag_e = pp->alternate_vertical_scan_flag;
    regs->reg52_error_concealment.sw_xdim_mbst = 0;
    regs->reg52_error_concealment.sw_ydim_mbst = 0;
    regs->reg50_dec_ctrl.sw_dblk_flt_dis = 1;
    regs->reg136.sw_rounding = pp->vop_rounding_type;
    regs->reg122.sw_intradc_vlc_thr = pp->intra_dc_vlc_thr;
    regs->reg51_stream_info.sw_qp_init_val = pp->vop_quant;
    regs->reg122.sw_sync_markers_en = 1;

    {
        /*
         * update stream base address here according to consumed bit length
         * 1. hardware start address has to be 64 bit align
         * 2. hardware need to know which is the start bit in
         * 2. pass (10bit fd + (offset << 10)) register value to kernel
         */
        RK_U32 val = regs->reg64_input_stream_base;
        RK_U32 consumed_bytes = stream_used >> 3;
        RK_U32 consumed_bytes_align = consumed_bytes & (~0x7);
        RK_U32 start_bit_offset = stream_used & 0x3F;
        RK_U32 left_bytes = stream_length - consumed_bytes_align;

        regs->reg64_input_stream_base = val;
        if (consumed_bytes_align)
            mpp_dev_set_reg_offset(ctx->dev, 64, consumed_bytes_align);
        regs->reg122.sw_stream_start_word = start_bit_offset;
        regs->reg51_stream_info.sw_stream_len = left_bytes;
    }
    regs->reg122.sw_vop_time_incr = pp->vop_time_increment_resolution;

    switch (pp->vop_coding_type) {
    case MPEG4_B_VOP : {
        RK_U32 time_bp = pp->time_bp;
        RK_U32 time_pp = pp->time_pp;

        RK_U32 trb_per_trd_d0  = MPP_DIV((((RK_S64)(1 * time_bp + 0)) << 27) + 1 * (time_pp - 1), time_pp);
        RK_U32 trb_per_trd_d1  = MPP_DIV((((RK_S64)(2 * time_bp + 1)) << 27) + 2 * (time_pp - 0), 2 * time_pp + 1);
        RK_U32 trb_per_trd_dm1 = MPP_DIV((((RK_S64)(2 * time_bp - 1)) << 27) + 2 * (time_pp - 1), 2 * time_pp - 1);

        regs->reg57_enable_ctrl.sw_pic_type_sel1 = 1;
        regs->reg57_enable_ctrl.sw_pic_type_sel0 = 1;
        regs->reg136.sw_rounding = 0;
        regs->reg131_ref0_base = 1;

        mpp_assert(ctx->fd_ref1 >= 0);
        if (ctx->fd_ref1 >= 0) {
            regs->reg131_ref0_base = (RK_U32)ctx->fd_ref1;
            regs->reg148_ref1_base = (RK_U32)ctx->fd_ref1;
        } else {
            regs->reg131_ref0_base = (RK_U32)ctx->fd_curr;
            regs->reg148_ref1_base = (RK_U32)ctx->fd_curr;
        }

        mpp_assert(ctx->fd_ref0 >= 0);
        if (ctx->fd_ref0 >= 0) {
            regs->reg134_ref2_base = (RK_U32)ctx->fd_ref0;
            regs->reg135_ref3_base = (RK_U32)ctx->fd_ref0;
        } else {
            regs->reg134_ref2_base = (RK_U32)ctx->fd_curr;
            regs->reg135_ref3_base = (RK_U32)ctx->fd_curr;
        }

        regs->reg136.sw_hrz_bit_of_fwd_mv = pp->vop_fcode_forward;
        regs->reg136.sw_vrz_bit_of_fwd_mv = pp->vop_fcode_forward;
        regs->reg136.sw_hrz_bit_of_bwd_mv = pp->vop_fcode_backward;
        regs->reg136.sw_vrz_bit_of_bwd_mv = pp->vop_fcode_backward;
        regs->reg57_enable_ctrl.sw_dmmv_wr_en = 0;
        regs->reg62_directmv_base = mv_buf_fd;
        regs->reg137.sw_trb_per_trd_d0 = trb_per_trd_d0;
        regs->reg139.sw_trb_per_trd_d1 = trb_per_trd_d1;
        regs->reg138.sw_trb_per_trd_dm1 = trb_per_trd_dm1;
    } break;
    case MPEG4_P_VOP : {
        regs->reg57_enable_ctrl.sw_pic_type_sel1 = 0;
        regs->reg57_enable_ctrl.sw_pic_type_sel0 = 1;

        if (ctx->fd_ref0 >= 0) {
            regs->reg131_ref0_base = (RK_U32)ctx->fd_ref0;
            regs->reg148_ref1_base = (RK_U32)ctx->fd_ref0;
        } else {
            regs->reg131_ref0_base = (RK_U32)ctx->fd_curr;
            regs->reg148_ref1_base = (RK_U32)ctx->fd_curr;
        }
        regs->reg134_ref2_base = (RK_U32)ctx->fd_curr;
        regs->reg135_ref3_base = (RK_U32)ctx->fd_curr;

        regs->reg136.sw_hrz_bit_of_fwd_mv = pp->vop_fcode_forward;
        regs->reg136.sw_vrz_bit_of_fwd_mv = pp->vop_fcode_forward;
        regs->reg57_enable_ctrl.sw_dmmv_wr_en = 1;
        regs->reg62_directmv_base = mv_buf_fd;
    } break;
    case MPEG4_I_VOP : {
        regs->reg57_enable_ctrl.sw_pic_type_sel1 = 0;
        regs->reg57_enable_ctrl.sw_pic_type_sel0 = 0;

        regs->reg131_ref0_base = (RK_U32)ctx->fd_curr;
        regs->reg148_ref1_base = (RK_U32)ctx->fd_curr;
        regs->reg134_ref2_base = (RK_U32)ctx->fd_curr;
        regs->reg135_ref3_base = (RK_U32)ctx->fd_curr;

        regs->reg57_enable_ctrl.sw_dmmv_wr_en = 0;
        regs->reg62_directmv_base = mv_buf_fd;

        regs->reg136.sw_hrz_bit_of_fwd_mv = 1;
        regs->reg136.sw_vrz_bit_of_fwd_mv = 1;
    } break;
    default : {
        /* no nothing */
    } break;
    }

    if (pp->interlaced) {
        regs->reg57_enable_ctrl.sw_curpic_code_sel = 1;
        regs->reg57_enable_ctrl.sw_curpic_stru_sel = 0;
        regs->reg120.sw_topfieldfirst_e = pp->top_field_first;
    }

    regs->reg136.sw_prev_pic_type = pp->prev_coding_type;
    regs->reg122.sw_quant_type_1_en = pp->quant_type;
    regs->reg61_qtable_base = mpp_buffer_get_fd(ctx->qp_table);
    regs->reg136.sw_fwd_mv_y_resolution = pp->quarter_sample;

}